

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::json_abi_v3_11_2::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
::basic_json(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *other)

{
  json_value jVar1;
  undefined7 uVar2;
  
  uVar2 = *(undefined7 *)&(other->m_data).field_0x1;
  jVar1 = (other->m_data).m_value;
  (this->m_data).m_type = (other->m_data).m_type;
  *(undefined7 *)&(this->m_data).field_0x1 = uVar2;
  (this->m_data).m_value = jVar1;
  assert_invariant(other,false);
  (other->m_data).m_type = null;
  (other->m_data).m_value.object = (object_t *)0x0;
  assert_invariant(this,true);
  return;
}

Assistant:

basic_json(basic_json&& other) noexcept
        : json_base_class_t(std::move(other)),
          m_data(std::move(other.m_data))
    {
        // check that passed value is valid
        other.assert_invariant(false); // NOLINT(bugprone-use-after-move,hicpp-invalid-access-moved)

        // invalidate payload
        other.m_data.m_type = value_t::null;
        other.m_data.m_value = {};

        set_parents();
        assert_invariant();
    }